

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

QRgbaFloat32 *
convertCMYKToRGBA32F
          (QRgbaFloat32 *buffer,uint *src,int count,QList<unsigned_int> *param_4,
          QDitherInfo *param_5)

{
  float *pfVar1;
  uint uVar2;
  QRgb QVar3;
  long lVar4;
  long in_FS_OFFSET;
  QColor QVar5;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < count) {
    lVar4 = 0;
    do {
      uVar2 = *(uint *)((long)src + lVar4);
      QVar5 = QColor::fromCmyk(uVar2 & 0xff,uVar2 >> 8 & 0xff,uVar2 >> 0x10 & 0xff,uVar2 >> 0x18,
                               0xff);
      local_48._0_8_ = QVar5._0_8_;
      local_48.ct._4_4_ = QVar5.ct._4_4_;
      local_48.ct.argb.pad = QVar5.ct._8_2_;
      QVar3 = QColor::rgba(&local_48);
      pfVar1 = &buffer->r + lVar4;
      *pfVar1 = (float)(QVar3 >> 0x10 & 0xff) * 0.003921569;
      pfVar1[1] = (float)(QVar3 >> 8 & 0xff) * 0.003921569;
      pfVar1[2] = (float)(QVar3 & 0xff) * 0.003921569;
      pfVar1[3] = (float)(QVar3 >> 0x18) * 0.003921569;
      lVar4 = lVar4 + 4;
    } while ((ulong)(uint)count << 2 != lVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return buffer;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL convertCMYKToRGBA32F(QRgbaFloat32 *buffer, const uint *src, int count,
                                                             const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = QRgbaFloat32::fromArgb32(QCmyk32::fromCmyk32(src[i]).toColor().rgba());

    return buffer;
}